

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  char *__dest;
  add_thousands_sep<char> thousands_sep;
  char *pcVar1;
  size_t __n;
  uint uStack_34;
  char local_2d [13];
  
  __dest = *it;
  thousands_sep.sep_.size_ = 1;
  thousands_sep.sep_.data_ = (char *)(this + 8);
  thousands_sep._16_8_ = (ulong)uStack_34 << 0x20;
  pcVar1 = internal::format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                     (local_2d,*(uint *)this,*(int *)(this + 4),thousands_sep);
  __n = (long)pcVar1 - (long)local_2d;
  if (__n != 0) {
    memcpy(__dest,local_2d,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }